

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FatSystem.cpp
# Opt level: O2

bool __thiscall FatSystem::findDirectory(FatSystem *this,FatPath *path,FatEntry *outputEntry)

{
  bool bVar1;
  bool bVar2;
  __type _Var3;
  ulong uVar4;
  ostream *poVar5;
  ulong uVar6;
  FatEntry *entry;
  pointer this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  vector<FatEntry,_std::allocator<FatEntry>_> entries;
  string name;
  uint local_110;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_100;
  FatPath *local_e8;
  FatSystem *local_e0;
  ulong local_d8;
  FatEntry *local_d0;
  vector<FatEntry,_std::allocator<FatEntry>_> local_c8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_e8 = path;
  FatPath::getParts_abi_cxx11_(&local_100,path);
  local_110 = (uint)this->rootDirectory;
  outputEntry->cluster = local_110;
  uVar6 = 0;
  local_e0 = this;
  local_d0 = outputEntry;
  do {
    uVar4 = (long)local_100.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_100.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5;
    if (uVar4 <= uVar6) {
LAB_0010f3e5:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_100);
      return uVar4 <= uVar6;
    }
    local_d8 = uVar4;
    bVar1 = std::operator!=(local_100.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + uVar6,"");
    if (bVar1) {
      std::__cxx11::string::string
                ((string *)&local_50,
                 (string *)
                 (local_100.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar6));
      strtolower(&local_b0,&local_50);
      std::__cxx11::string::operator=
                ((string *)
                 (local_100.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar6),(string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_50);
      getEntries(&local_c8,local_e0,local_110,(int *)0x0,(bool *)0x0);
      bVar1 = false;
      for (this_00 = local_c8.super__Vector_base<FatEntry,_std::allocator<FatEntry>_>._M_impl.
                     super__Vector_impl_data._M_start;
          this_00 !=
          local_c8.super__Vector_base<FatEntry,_std::allocator<FatEntry>_>._M_impl.
          super__Vector_impl_data._M_finish; this_00 = this_00 + 1) {
        FatEntry::getFilename_abi_cxx11_(&local_b0,this_00);
        bVar2 = FatEntry::isDirectory(this_00);
        if (bVar2) {
          std::__cxx11::string::string((string *)&local_90,(string *)&local_b0);
          strtolower(&local_70,&local_90);
          _Var3 = std::operator==(&local_70,
                                  local_100.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + uVar6);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_90);
          if (_Var3) {
            FatEntry::operator=(local_d0,this_00);
            local_110 = this_00->cluster;
            bVar1 = true;
          }
        }
        std::__cxx11::string::~string((string *)&local_b0);
      }
      if (!bVar1) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Error: directory ");
        FatPath::getPath_abi_cxx11_(&local_b0,local_e8);
        poVar5 = std::operator<<(poVar5,(string *)&local_b0);
        poVar5 = std::operator<<(poVar5," not found");
        std::endl<char,std::char_traits<char>>(poVar5);
        std::__cxx11::string::~string((string *)&local_b0);
        std::vector<FatEntry,_std::allocator<FatEntry>_>::~vector(&local_c8);
        uVar4 = local_d8;
        goto LAB_0010f3e5;
      }
      std::vector<FatEntry,_std::allocator<FatEntry>_>::~vector(&local_c8);
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

bool FatSystem::findDirectory(FatPath &path, FatEntry &outputEntry)
{
    int cluster;
    vector<string> parts = path.getParts();
    cluster = rootDirectory;
    outputEntry.cluster = cluster;

    for (int i=0; i<parts.size(); i++) {
        if (parts[i] != "") {
            parts[i] = strtolower(parts[i]);
            vector<FatEntry> entries = getEntries(cluster);
            vector<FatEntry>::iterator it;
            bool found = false;

            for (it=entries.begin(); it!=entries.end(); it++) {
                FatEntry &entry = *it;
                string name = entry.getFilename();
                if (entry.isDirectory() && strtolower(name) == parts[i]) {
                    outputEntry = entry;
                    cluster = entry.cluster;
                    found = true;
                }
            }

            if (!found) {
                cerr << "Error: directory " << path.getPath() << " not found" << endl;
                return false;
            }
        }
    }

    return true;
}